

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_build_prediction_by_left_preds
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,uint8_t **tmp_buf,int *tmp_width,
               int *tmp_height,int *tmp_stride)

{
  int iVar1;
  uint uVar2;
  void *in_RCX;
  overlappable_nb_visitor_t in_RDX;
  int *in_RSI;
  MACROBLOCKD *in_RDI;
  AV1_COMMON *unaff_retaddr;
  BLOCK_SIZE bsize;
  build_prediction_ctxt ctxt;
  int pred_width;
  int this_width;
  MACROBLOCKD *xd;
  uint local_80;
  
  if ((*(byte *)((long)in_RSI + 0x1ec1) & 1) != 0) {
    uVar2 = (uint)*(byte *)(in_RSI + 0x81d) * 4;
    if (uVar2 / 2 < 0x20) {
      local_80 = uVar2 / 2;
    }
    else {
      local_80 = 0x20;
    }
    in_RSI[0x7be] = (uVar2 - local_80) * 8 + in_RSI[0x7be];
    iVar1 = in_RSI[0x7c0];
    foreach_overlappable_nb_left(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,in_RCX);
    in_RSI[0x7bf] = *in_RSI * -0x20;
    in_RSI[0x7be] = in_RSI[0x7be] + (uVar2 - local_80) * -8;
    in_RSI[0x7c0] = iVar1;
  }
  return;
}

Assistant:

static inline void dec_build_prediction_by_left_preds(
    const AV1_COMMON *cm, DecoderCodingBlock *dcb,
    uint8_t *tmp_buf[MAX_MB_PLANE], int tmp_width[MAX_MB_PLANE],
    int tmp_height[MAX_MB_PLANE], int tmp_stride[MAX_MB_PLANE]) {
  MACROBLOCKD *const xd = &dcb->xd;
  if (!xd->left_available) return;

  // Adjust mb_to_right_edge to have the correct value for the OBMC
  // prediction block. This is half the width of the original block,
  // except for 128-wide blocks, where we only use a width of 32.
  const int this_width = xd->width * MI_SIZE;
  const int pred_width = AOMMIN(this_width / 2, 32);
  xd->mb_to_right_edge += GET_MV_SUBPEL(this_width - pred_width);

  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_bottom_edge, dcb
  };
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               dec_build_prediction_by_left_pred, &ctxt);

  xd->mb_to_top_edge = -GET_MV_SUBPEL(xd->mi_row * MI_SIZE);
  xd->mb_to_right_edge -= GET_MV_SUBPEL(this_width - pred_width);
  xd->mb_to_bottom_edge = ctxt.mb_to_far_edge;
}